

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O0

void Logger::setFlags(ErrorType type)

{
  ErrorType type_local;
  
  switch(type) {
  case Warning:
    if (errorOnWarning) {
      error = true;
    }
    break;
  case Error:
    error = true;
    break;
  case FatalError:
    error = true;
    fatalError = true;
    break;
  case Notice:
  }
  return;
}

Assistant:

void Logger::setFlags(ErrorType type)
{
	switch (type)
	{
	case Warning:
		if (errorOnWarning)
			error = true;
		break;
	case Error:
		error = true;
		break;
	case FatalError:
		error = true;
		fatalError = true;
		break;
	case Notice:
		break;
	}
}